

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void decode_bitfield(uint32_t data,bitfield_desc *bfdesc)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar4 = (ulong)data;
  if (data == 0) {
    fputs("NONE",_stdout);
  }
  pcVar5 = ", ";
  bVar1 = false;
  do {
    uVar3 = (uint)uVar4;
    if (uVar3 == 0) {
LAB_0024f331:
      fprintf(_stdout," (0x%x)",(ulong)data);
      return;
    }
    if (bfdesc->name == (char *)0x0) {
      if (!bVar1) {
        pcVar5 = "";
      }
      fprintf(_stdout,"%sUNK%x",pcVar5,uVar4);
      goto LAB_0024f331;
    }
    if ((bfdesc->mask & uVar3) != 0) {
      pcVar2 = ", ";
      if (!bVar1) {
        pcVar2 = "";
      }
      fprintf(_stdout,"%s%s",pcVar2);
      uVar4 = (ulong)(uVar3 & ~bfdesc->mask);
      bVar1 = true;
    }
    bfdesc = bfdesc + 1;
  } while( true );
}

Assistant:

void decode_bitfield(uint32_t data, struct bitfield_desc *bfdesc)
{
	uint32_t data_ = data;
	int printed = 0;

	if (!data)
		mmt_log_cont("%s", "NONE");

	while (data && bfdesc->name)
	{
		if (data & bfdesc->mask)
		{
			mmt_log_cont("%s%s", printed ? ", " : "", bfdesc->name);
			data &= ~bfdesc->mask;
			printed = 1;
		}
		bfdesc++;
	}

	if (data)
		mmt_log_cont("%sUNK%x", printed ? ", " : "", data);

	mmt_log_cont(" (0x%x)", data_);
}